

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::TiledRgbaOutputFile::TiledRgbaOutputFile
          (TiledRgbaOutputFile *this,OStream *os,Header *header,RgbaChannels rgbaChannels,
          int tileXSize,int tileYSize,LevelMode mode,LevelRoundingMode rmode,int numThreads)

{
  void *pvVar1;
  uint in_ECX;
  undefined8 *in_RDI;
  uint in_R8D;
  uint in_R9D;
  LevelMode in_stack_00000008;
  LevelRoundingMode in_stack_00000010;
  Header hd;
  int in_stack_0000017c;
  Header *in_stack_00000180;
  OStream *in_stack_00000188;
  TiledOutputFile *in_stack_00000190;
  RgbaChannels in_stack_0000019c;
  Header *in_stack_000001a0;
  undefined4 in_stack_ffffffffffffff70;
  uint uVar2;
  Header *in_stack_ffffffffffffff88;
  Header *in_stack_ffffffffffffff90;
  RgbaChannels in_stack_ffffffffffffffa4;
  TiledOutputFile *in_stack_ffffffffffffffa8;
  ToYa *in_stack_ffffffffffffffb0;
  
  *in_RDI = &PTR__TiledRgbaOutputFile_002ad4d0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  Header::Header(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  uVar2 = in_ECX;
  OStream::fileName((OStream *)0x24b650);
  anon_unknown_23::insertChannels(in_stack_000001a0,in_stack_0000019c,(char *)in_stack_00000190);
  TileDescription::TileDescription
            ((TileDescription *)&stack0xffffffffffffff84,in_R8D,in_R9D,in_stack_00000008,
             in_stack_00000010);
  Header::setTileDescription(in_stack_ffffffffffffff90,(TileDescription *)in_stack_ffffffffffffff88)
  ;
  pvVar1 = operator_new(0x20);
  TiledOutputFile::TiledOutputFile
            (in_stack_00000190,in_stack_00000188,in_stack_00000180,in_stack_0000017c);
  in_RDI[1] = pvVar1;
  if ((in_ECX & 0x10) != 0) {
    pvVar1 = operator_new(0x78);
    ToYa::ToYa(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
    in_RDI[2] = pvVar1;
  }
  Header::~Header((Header *)CONCAT44(uVar2,in_stack_ffffffffffffff70));
  return;
}

Assistant:

TiledRgbaOutputFile::TiledRgbaOutputFile (
    OPENEXR_IMF_INTERNAL_NAMESPACE::OStream& os,
    const Header&                            header,
    RgbaChannels                             rgbaChannels,
    int                                      tileXSize,
    int                                      tileYSize,
    LevelMode                                mode,
    LevelRoundingMode                        rmode,
    int                                      numThreads)
    : _outputFile (0), _toYa (0)
{
    Header hd (header);
    insertChannels (hd, rgbaChannels, os.fileName ());
    hd.setTileDescription (TileDescription (tileXSize, tileYSize, mode, rmode));
    _outputFile = new TiledOutputFile (os, hd, numThreads);

    if (rgbaChannels & WRITE_Y) _toYa = new ToYa (*_outputFile, rgbaChannels);
}